

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::reporters::Reporter_testLoggingReporter_Test::TestBody
          (Reporter_testLoggingReporter_Test *this)

{
  undefined1 *logger_00;
  int local_3c;
  int i;
  int kNumReports;
  LoggingReporter local_28 [8];
  LoggingReporter reporter;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  local_18;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  Reporter_testLoggingReporter_Test *this_local;
  
  logger._M_t.
  super___uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::logging::Logger_*,_std::default_delete<jaegertracing::logging::Logger>_>
  .super__Head_base<0UL,_jaegertracing::logging::Logger_*,_false>._M_head_impl =
       (__uniq_ptr_data<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>,_true,_true>
        )(__uniq_ptr_data<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>,_true,_true>
          )this;
  jaegertracing::logging::nullLogger();
  logger_00 = (undefined1 *)
              std::
              unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
              ::operator*(&local_18);
  LoggingReporter::LoggingReporter(local_28,(Logger *)logger_00);
  for (local_3c = 0; local_3c < 100; local_3c = local_3c + 1) {
    logger_00 = (anonymous_namespace)::span;
    jaegertracing::reporters::LoggingReporter::report((Span *)local_28);
  }
  LoggingReporter::close(local_28,(int)logger_00);
  LoggingReporter::~LoggingReporter(local_28);
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(Reporter, testLoggingReporter)
{
    const auto logger = logging::nullLogger();
    LoggingReporter reporter(*logger);
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    reporter.close();
}